

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessorTests.cpp
# Opt level: O2

void __thiscall
solitaire::events::EventsProcessorTests::acceptLeftButtonDownOnCoveredStockPileCards
          (EventsProcessorTests *this,MouseLeftButtonDown *event)

{
  TypedExpectation<bool_(const_solitaire::geometry::Position_&)> *this_00;
  TypedExpectation<solitaire::interfaces::Solitaire_&()> *this_01;
  _Any_data *this_02;
  SolitaireMock *this_03;
  ReturnAction<bool> local_80;
  undefined1 local_70 [32];
  MatcherBase<const_solitaire::geometry::Position_&> local_50;
  _Any_data local_38 [2];
  
  testing::Matcher<const_solitaire::geometry::Position_&>::Matcher
            ((Matcher<const_solitaire::geometry::Position_&> *)&local_50,&event->position);
  colliders::StockPileColliderMock::gmock_coveredCardsCollidesWith
            ((MockSpec<bool_(const_solitaire::geometry::Position_&)> *)local_70,
             &(this->stockPileColliderMock).super_StockPileColliderMock,
             (Matcher<const_solitaire::geometry::Position_&> *)&local_50);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<bool_(const_solitaire::geometry::Position_&)>::
            InternalExpectedAt((MockSpec<bool_(const_solitaire::geometry::Position_&)> *)local_70,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/EventsProcessorTests.cpp"
                               ,0x7b,"stockPileColliderMock",
                               "coveredCardsCollidesWith(event.position)");
  testing::internal::ReturnAction<bool>::ReturnAction(&local_80,true);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<bool_(const_solitaire::geometry::Position_&)> *)local_38,
             (ReturnAction *)&local_80);
  this_02 = local_38;
  testing::internal::TypedExpectation<bool_(const_solitaire::geometry::Position_&)>::WillOnce
            (this_00,(Action<bool_(const_solitaire::geometry::Position_&)> *)this_02);
  std::_Function_base::~_Function_base((_Function_base *)local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_80.value_.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::MatcherBase<const_solitaire::geometry::Position_&>::~MatcherBase
            ((MatcherBase<const_solitaire::geometry::Position_&> *)(local_70 + 8));
  testing::internal::MatcherBase<const_solitaire::geometry::Position_&>::~MatcherBase(&local_50);
  local_38[0]._0_8_ =
       ContextMock::gmock_getSolitaire
                 ((MockSpec<solitaire::interfaces::Solitaire_&()> *)&this->contextMock,
                  (ContextMock *)this_02);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::MockSpec<solitaire::interfaces::Solitaire_&()>::InternalExpectedAt
                      ((MockSpec<solitaire::interfaces::Solitaire_&()> *)local_38,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/EventsProcessorTests.cpp"
                       ,0x7d,"contextMock","getSolitaire()");
  this_03 = (SolitaireMock *)local_70;
  local_50.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&this->solitaireMock;
  testing::internal::ReturnRefAction::operator_cast_to_Action
            ((Action<solitaire::interfaces::Solitaire_&()> *)this_03,(ReturnRefAction *)&local_50);
  testing::internal::TypedExpectation<solitaire::interfaces::Solitaire_&()>::WillOnce
            (this_01,(Action<solitaire::interfaces::Solitaire_&()> *)this_03);
  std::_Function_base::~_Function_base((_Function_base *)local_70);
  local_70._0_8_ =
       SolitaireMock::gmock_trySelectNextStockPileCard
                 ((MockSpec<void_()> *)&this->solitaireMock,this_03);
  testing::internal::GetWithoutMatchers();
  testing::internal::MockSpec<void_()>::InternalExpectedAt
            ((MockSpec<void_()> *)local_70,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/EventsProcessorTests.cpp"
             ,0x7e,"solitaireMock","trySelectNextStockPileCard()");
  return;
}

Assistant:

void acceptLeftButtonDownOnCoveredStockPileCards(const MouseLeftButtonDown& event) {
        EXPECT_CALL(stockPileColliderMock, coveredCardsCollidesWith(event.position))
            .WillOnce(Return(true));
        EXPECT_CALL(contextMock, getSolitaire()).WillOnce(ReturnRef(solitaireMock));
        EXPECT_CALL(solitaireMock, trySelectNextStockPileCard());
    }